

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableSpiAnalyzer.cpp
# Opt level: O0

void __thiscall EnrichableSpiAnalyzer::WorkerThread(EnrichableSpiAnalyzer *this)

{
  char *pcVar1;
  element_type *peVar2;
  element_type *peVar3;
  allocator local_31;
  string local_30 [32];
  EnrichableSpiAnalyzer *local_10;
  EnrichableSpiAnalyzer *this_local;
  
  local_10 = this;
  Setup(this);
  peVar2 = std::auto_ptr<EnrichableAnalyzerSubprocess>::operator->(&this->mSubprocess);
  peVar3 = std::auto_ptr<EnrichableSpiAnalyzerSettings>::operator->(&this->mSettings);
  pcVar1 = peVar3->mParserCommand;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pcVar1,&local_31);
  EnrichableAnalyzerSubprocess::SetParserCommand(peVar2,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  peVar2 = std::auto_ptr<EnrichableAnalyzerSubprocess>::operator->(&this->mSubprocess);
  EnrichableAnalyzerSubprocess::Start(peVar2);
  AdvanceToActiveEnableEdgeWithCorrectClockPolarity(this);
  do {
    GetWord(this);
    Analyzer::CheckIfThreadShouldExit();
  } while( true );
}

Assistant:

void EnrichableSpiAnalyzer::WorkerThread()
{
	Setup();

	mSubprocess->SetParserCommand(mSettings->mParserCommand);
	mSubprocess->Start();

	AdvanceToActiveEnableEdgeWithCorrectClockPolarity();

	for( ; ; )
	{
		GetWord();
		CheckIfThreadShouldExit();
	}

	mSubprocess->Stop();
}